

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O3

void __thiscall
GlobOpt::KillObjectHeaderInlinedTypeSyms
          (GlobOpt *this,BasicBlock *block,bool isObjTypeSpecialized,SymID opndId)

{
  Type TVar1;
  EquivalentTypeSet *this_00;
  code *pcVar2;
  bool bVar3;
  TypeId TVar4;
  undefined4 *puVar5;
  Value *pVVar6;
  JsTypeValueInfo *pJVar7;
  JITType *pJVar8;
  JITTypeHandler *pJVar9;
  SymID typeSymId;
  Type_conflict pBVar10;
  uint16 index;
  ulong uVar11;
  ulong uVar12;
  nullptr_t local_48;
  JITTypeHolderBase<void> local_40;
  JITTypeHolder type;
  
  if ((this->objectTypeSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0) &&
     (pBVar10 = this->objectTypeSyms->head, pBVar10 != (Type_conflict)0x0)) {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      uVar11 = (pBVar10->data).word;
      if (uVar11 != 0) {
        TVar1 = pBVar10->startIndex;
        uVar12 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
          }
        }
        do {
          typeSymId = TVar1 + (BVIndex)uVar12;
          BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar12);
          type.t._4_4_ = typeSymId;
          if ((!isObjTypeSpecialized || typeSymId != opndId) &&
             (pVVar6 = GlobOptBlockData::FindObjectTypeValue(&block->globOptData,typeSymId),
             pVVar6 != (Value *)0x0)) {
            pJVar7 = ValueInfo::AsJsType(pVVar6->valueInfo);
            if (pJVar7 == (JsTypeValueInfo *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar5 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                                 ,0x3f7,"(valueInfo)","valueInfo");
              if (!bVar3) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              *puVar5 = 0;
            }
            local_40.t = (pJVar7->jsType).t;
            local_48 = (nullptr_t)0x0;
            bVar3 = JITTypeHolderBase<void>::operator!=(&local_40,&local_48);
            if (bVar3) {
              local_40.t = (pJVar7->jsType).t;
              pJVar8 = JITTypeHolderBase<void>::operator->(&local_40);
              TVar4 = JITType::GetTypeId(pJVar8);
              bVar3 = Js::DynamicType::Is(TVar4);
              if (bVar3) {
                pJVar8 = JITTypeHolderBase<void>::operator->(&local_40);
                pJVar9 = JITType::GetTypeHandler(pJVar8);
                bVar3 = JITTypeHandler::IsObjectHeaderInlinedTypeHandler(pJVar9);
                if (bVar3) {
LAB_0049a600:
                  BVSparse<Memory::JitArenaAllocator>::Clear
                            ((this->currentBlock->globOptData).liveFields,type.t._4_4_);
                }
              }
            }
            else {
              this_00 = pJVar7->jsTypeSet;
              if ((this_00 != (EquivalentTypeSet *)0x0) && (this_00->count != 0)) {
                index = 0;
                do {
                  local_40.t = (Type)Js::EquivalentTypeSet::GetType(this_00,index);
                  local_48 = (nullptr_t)0x0;
                  bVar3 = JITTypeHolderBase<void>::operator!=(&local_40,&local_48);
                  if (bVar3) {
                    pJVar8 = JITTypeHolderBase<void>::operator->(&local_40);
                    TVar4 = JITType::GetTypeId(pJVar8);
                    bVar3 = Js::DynamicType::Is(TVar4);
                    if (bVar3) {
                      pJVar8 = JITTypeHolderBase<void>::operator->(&local_40);
                      pJVar9 = JITType::GetTypeHandler(pJVar8);
                      bVar3 = JITTypeHandler::IsObjectHeaderInlinedTypeHandler(pJVar9);
                      if (bVar3) goto LAB_0049a600;
                    }
                  }
                  index = index + 1;
                } while (index < this_00->count);
              }
            }
          }
          uVar11 = uVar11 & ~(1L << (uVar12 & 0x3f));
          uVar12 = 0;
          if (uVar11 != 0) {
            for (; (uVar11 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
            }
          }
        } while (uVar11 != 0);
      }
      pBVar10 = pBVar10->next;
    } while (pBVar10 != (Type)0x0);
  }
  return;
}

Assistant:

void
GlobOpt::KillObjectHeaderInlinedTypeSyms(BasicBlock *block, bool isObjTypeSpecialized, SymID opndId)
{
    this->MapObjectHeaderInlinedTypeSymsUntil(block, isObjTypeSpecialized, opndId, [&](SymID symId)->bool  { this->currentBlock->globOptData.liveFields->Clear(symId); return false; });
}